

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

error_code __thiscall
anon_unknown.dwarf_60e82::DirectoryContentsTask::getContents
          (DirectoryContentsTask *this,StringRef path,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames)

{
  undefined8 this_00;
  bool bVar1;
  directory_entry *pdVar2;
  reference status;
  string *Str;
  undefined8 uVar3;
  directory_iterator *pdVar4;
  iterator iVar5;
  iterator iVar6;
  error_code eVar7;
  byte local_29a;
  StringRef local_288;
  StringRef local_278;
  string local_268;
  StringRef local_248;
  Twine local_238;
  error_code local_220;
  undefined1 local_210 [8];
  SmallString<256U> resolvedPath;
  undefined1 local_c0 [8];
  directory_iterator end;
  undefined1 local_90 [8];
  directory_iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *filenames_local;
  StringRef path_local;
  error_code ec;
  int local_c;
  
  it._16_8_ = path.Length;
  path_local.Data = path.Data;
  filenames_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  std::error_code::error_code((error_code *)&path_local.Length);
  llvm::Twine::Twine((Twine *)&end.FollowSymlinks,(StringRef *)&filenames_local);
  llvm::sys::fs::directory_iterator::directory_iterator
            ((directory_iterator *)local_90,(Twine *)&end.FollowSymlinks,
             (error_code *)&path_local.Length,false);
  memset(local_c0,0,0x18);
  llvm::sys::fs::directory_iterator::directory_iterator((directory_iterator *)local_c0);
  do {
    bVar1 = llvm::sys::fs::directory_iterator::operator!=
                      ((directory_iterator *)local_90,(directory_iterator *)local_c0);
    local_29a = 0;
    if (bVar1) {
      bVar1 = std::error_code::operator_cast_to_bool((error_code *)&path_local.Length);
      local_29a = bVar1 ^ 0xff;
    }
    if ((local_29a & 1) == 0) {
      llvm::sys::fs::directory_iterator::~directory_iterator((directory_iterator *)local_c0);
      llvm::sys::fs::directory_iterator::~directory_iterator((directory_iterator *)local_90);
      iVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)it._16_8_);
      iVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)it._16_8_);
      std::
      sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(anonymous_namespace)::DirectoryContentsTask::getContents(llvm::StringRef,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>
                (iVar5._M_current,iVar6._M_current);
      eVar7._4_4_ = 0;
      eVar7._M_value = (uint)path_local.Length;
      eVar7._M_cat = (error_category *)ec._0_8_;
      return eVar7;
    }
    pdVar2 = llvm::sys::fs::directory_iterator::operator->((directory_iterator *)local_90);
    llvm::sys::fs::directory_entry::status
              ((ErrorOr<llvm::sys::fs::basic_file_status> *)
               (resolvedPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                InlineElts + 0xf8),pdVar2);
    status = llvm::ErrorOr<llvm::sys::fs::basic_file_status>::operator*
                       ((ErrorOr<llvm::sys::fs::basic_file_status> *)
                        (resolvedPath.super_SmallVector<char,_256U>.
                         super_SmallVectorStorage<char,_256U>.InlineElts + 0xf8));
    bVar1 = llvm::sys::fs::is_symlink_file(status);
    llvm::ErrorOr<llvm::sys::fs::basic_file_status>::~ErrorOr
              ((ErrorOr<llvm::sys::fs::basic_file_status> *)
               (resolvedPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                InlineElts + 0xf8));
    if (bVar1) {
      llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_210);
      pdVar2 = llvm::sys::fs::directory_iterator::operator->((directory_iterator *)local_90);
      Str = llvm::sys::fs::directory_entry::path_abi_cxx11_(pdVar2);
      llvm::Twine::Twine(&local_238,Str);
      eVar7 = llvm::sys::fs::real_path(&local_238,(SmallVectorImpl<char> *)local_210,false);
      local_220._M_cat = eVar7._M_cat;
      local_220._M_value = eVar7._M_value;
      bVar1 = std::error_code::operator_cast_to_bool(&local_220);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_001463d4:
        bVar1 = false;
      }
      else {
        local_248 = llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_210);
        bVar1 = false;
        if (local_248.Length <= path_local.Data) {
          if ((char *)local_248.Length == (char *)0x0) {
            local_c = 0;
          }
          else {
            local_c = memcmp(filenames_local,local_248.Data,local_248.Length);
          }
          bVar1 = local_c == 0;
        }
        if (!bVar1) goto LAB_001463d4;
        bVar1 = true;
      }
      llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_210);
      if (!bVar1) goto LAB_001463fd;
    }
    else {
LAB_001463fd:
      this_00 = it._16_8_;
      pdVar2 = llvm::sys::fs::directory_iterator::operator->((directory_iterator *)local_90);
      llvm::sys::fs::directory_entry::path_abi_cxx11_(pdVar2);
      uVar3 = std::__cxx11::string::data();
      local_288.Data = (char *)uVar3;
      uVar3 = std::__cxx11::string::length();
      local_288.Length = uVar3;
      local_278 = llvm::sys::path::filename(local_288,native);
      llvm::StringRef::operator_cast_to_string(&local_268,&local_278);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00,&local_268);
      std::__cxx11::string::~string((string *)&local_268);
    }
    pdVar4 = llvm::sys::fs::directory_iterator::increment
                       ((directory_iterator *)local_90,(error_code *)&path_local.Length);
    llvm::sys::fs::directory_iterator::operator=((directory_iterator *)local_90,pdVar4);
  } while( true );
}

Assistant:

static std::error_code getContents(StringRef path, std::vector<std::string>& filenames) {
    // Get the list of files in the directory.
    // FIXME: This is not going through the filesystem object. Indeed the fs
    // object does not currently support directory listing/iteration, but
    // probably should so that clients may override it.
    //
    // Exit the loop if we encounter any errors, to prevent infinitely looping
    // over an invalid directory in some circumstances. rdar://101717159
    std::error_code ec;
    for (auto it = llvm::sys::fs::directory_iterator(path, ec, /*follow_symlinks */false),
         end = llvm::sys::fs::directory_iterator(); it != end && !ec;
         it = it.increment(ec)) {
      // If this is a symlink to a parent directory, exclude it from results so we don't get stuck in a loop.
      if (llvm::sys::fs::is_symlink_file(*it->status())) {
        SmallString<256> resolvedPath;
        if (!llvm::sys::fs::real_path(it->path(), resolvedPath)) {
          if (path.startswith(resolvedPath)) {
            continue;
          }
        }
      }
      filenames.push_back(llvm::sys::path::filename(it->path()));
    }

    // Order the filenames.
    std::sort(filenames.begin(), filenames.end(),
              [](const std::string& a, const std::string& b) {
                return a < b;
              });

    return ec;
  }